

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::subcase_start
          (ConsoleReporter *this,SubcaseSignature *subc)

{
  std::mutex::lock(&this->mutex);
  std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::push_back
            (&this->subcasesStack,subc);
  this->currentSubcaseLevel = this->currentSubcaseLevel + 1;
  this->hasLoggedCurrentTestStart = false;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void subcase_start(const SubcaseSignature& subc) override {
            std::lock_guard<std::mutex> lock(mutex);
            subcasesStack.push_back(subc);
            ++currentSubcaseLevel;
            hasLoggedCurrentTestStart = false;
        }